

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

void array_delete<Lib::DArray<std::__cxx11::string>>
               (DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *array,size_t length)

{
  DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  bool bVar1;
  
  this = array + length;
  while( true ) {
    this = this + -1;
    bVar1 = length == 0;
    length = length - 1;
    if (bVar1) break;
    Lib::DArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~DArray(this);
  }
  return;
}

Assistant:

void array_delete(T* array, size_t length)
{
  ASS_NEQ(array,0);
  ASS_G(length,0);

  array+=length;
  while(length--) {
    (--array)->~T();
  }
}